

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::AdapterPromiseNode<kj::_::Void,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite>::destroy
          (AdapterPromiseNode<kj::_::Void,_kj::(anonymous_namespace)::AsyncPipe::BlockedWrite> *this
          )

{
  AsyncPipe *pAVar1;
  
  pAVar1 = (this->adapter).pipe;
  if ((BlockedWrite *)(pAVar1->state).ptr == &this->adapter) {
    (pAVar1->state).ptr = (AsyncCapabilityStream *)0x0;
  }
  Canceler::~Canceler(&(this->adapter).canceler);
  OneOf<kj::ArrayPtr<const_int>,_kj::Array<kj::Own<kj::AsyncCapabilityStream,_std::nullptr_t>_>_>::
  ~OneOf(&(this->adapter).capBuffer);
  AsyncIoStream::~AsyncIoStream((AsyncIoStream *)&this->adapter);
  NullableValue<kj::Exception>::~NullableValue((NullableValue<kj::Exception> *)&this->result);
  AsyncObject::~AsyncObject((AsyncObject *)&this->super_PromiseFulfiller<void>);
  AsyncObject::~AsyncObject((AsyncObject *)this);
  return;
}

Assistant:

void destroy() override { freePromise(this); }